

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O0

int lj_cf_misc_memprof_stop(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  int status;
  char *unaff_retaddr;
  lua_State *in_stack_00000018;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = lj_memprof_stop(in_stack_00000018);
  if (iVar1 == 2) {
    lua_pushnil(in_RDI);
    lua_pushstring(L,unaff_retaddr);
    lua_pushinteger(in_RDI,CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    iVar1 = 3;
  }
  else if (iVar1 == 0) {
    lua_pushboolean(in_RDI,0);
    iVar1 = 1;
  }
  else {
    iVar1 = prof_error((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20),
                       (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  return iVar1;
}

Assistant:

LJLIB_CF(misc_memprof_stop)
{
#if !LJ_HASMEMPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  int status = lj_memprof_stop(L);
  if (LJ_UNLIKELY(status == PROFILE_ERRRUN)) {
    lua_pushnil(L);
    lua_pushstring(L, err2msg(LJ_ERR_PROF_NOTRUNNING));
    lua_pushinteger(L, EINVAL);
    return 3;
  } else if (LJ_UNLIKELY(status != PROFILE_SUCCESS)) {
    return prof_error(L, status, NULL);
  }

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASMEMPROF */
}